

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O2

bool embree::os_init(bool hugepages,bool verbose)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  istream *piVar5;
  ostream *poVar6;
  undefined7 in_register_00000039;
  bool bVar7;
  string unit;
  string val;
  Lock<embree::MutexSys> lock;
  string tag;
  string line;
  stringstream sline;
  byte abStack_3a0 [360];
  ifstream file;
  
  lock.mutex = (MutexSys *)&os_init_mutex;
  lock.locked = true;
  MutexSys::lock((MutexSys *)&os_init_mutex);
  if ((int)CONCAT71(in_register_00000039,hugepages) == 0) {
    huge_pages_enabled = 0;
    bVar7 = true;
  }
  else {
    std::ifstream::ifstream(&file);
    std::ifstream::open((char *)&file,0x244203);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      if (verbose) {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "WARNING: Could not open /proc/meminfo. Huge page support cannot get enabled!"
                                );
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      huge_pages_enabled = 0;
      bVar7 = false;
    }
    else {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      iVar4 = 0;
      do {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&file,(string *)&line);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&sline,(string *)&line,_S_out|_S_in);
        while ((abStack_3a0[*(long *)(_sline + -0x18)] & 2) == 0) {
          iVar3 = std::istream::peek();
          if (iVar3 != 0x20) break;
          std::istream::ignore();
        }
        tag._M_dataplus._M_p = (pointer)&tag.field_2;
        tag._M_string_length = 0;
        tag.field_2._M_local_buf[0] = '\0';
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&sline,(string *)&tag,' ');
        while ((abStack_3a0[*(long *)(_sline + -0x18)] & 2) == 0) {
          iVar3 = std::istream::peek();
          if (iVar3 != 0x20) break;
          std::istream::ignore();
        }
        val._M_dataplus._M_p = (pointer)&val.field_2;
        val._M_string_length = 0;
        val.field_2._M_local_buf[0] = '\0';
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&sline,(string *)&val,' ');
        while ((abStack_3a0[*(long *)(_sline + -0x18)] & 2) == 0) {
          iVar3 = std::istream::peek();
          if (iVar3 != 0x20) break;
          std::istream::ignore();
        }
        unit._M_dataplus._M_p = (pointer)&unit.field_2;
        unit._M_string_length = 0;
        unit.field_2._M_local_buf[0] = '\0';
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&sline,(string *)&unit,' ');
        bVar2 = std::operator==(&tag,"Hugepagesize:");
        bVar7 = true;
        if (bVar2) {
          bVar2 = std::operator==(&unit,"kB");
          if (bVar2) {
            iVar4 = std::__cxx11::stoi(&val,(size_t *)0x0,10);
            iVar4 = iVar4 << 10;
            bVar7 = false;
          }
        }
        std::__cxx11::string::~string((string *)&unit);
        std::__cxx11::string::~string((string *)&val);
        std::__cxx11::string::~string((string *)&tag);
        std::__cxx11::stringstream::~stringstream((stringstream *)&sline);
      } while (bVar7);
      bVar7 = iVar4 == 0x200000;
      if (verbose && !bVar7) {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "WARNING: Only 2MB huge pages supported. Huge page support cannot get enabled!"
                                );
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      huge_pages_enabled = iVar4 == 0x200000;
      std::__cxx11::string::~string((string *)&line);
    }
    std::ifstream::~ifstream(&file);
  }
  Lock<embree::MutexSys>::~Lock(&lock);
  return bVar7;
}

Assistant:

bool os_init(bool hugepages, bool verbose) 
  {
    Lock<MutexSys> lock(os_init_mutex);

    if (!hugepages) {
      huge_pages_enabled = false;
      return true;
    }

#if defined(__LINUX__)

    int hugepagesize = 0;

    std::ifstream file; 
    file.open("/proc/meminfo",std::ios::in);
    if (!file.is_open()) {
      if (verbose) std::cout << "WARNING: Could not open /proc/meminfo. Huge page support cannot get enabled!" << std::endl;
      huge_pages_enabled = false;
      return false;
    }
    
    std::string line;
    while (getline(file,line))
    {
      std::stringstream sline(line);
      while (!sline.eof() && sline.peek() == ' ') sline.ignore();
      std::string tag; getline(sline,tag,' ');
      while (!sline.eof() && sline.peek() == ' ') sline.ignore();
      std::string val; getline(sline,val,' ');
      while (!sline.eof() && sline.peek() == ' ') sline.ignore();
      std::string unit; getline(sline,unit,' ');
      if (tag == "Hugepagesize:" && unit == "kB") {
	hugepagesize = std::stoi(val)*1024;
	break;
      }
    }
    
    if (hugepagesize != PAGE_SIZE_2M) 
    {
      if (verbose) std::cout << "WARNING: Only 2MB huge pages supported. Huge page support cannot get enabled!" << std::endl;
      huge_pages_enabled = false;
      return false;
    }
#endif

    huge_pages_enabled = true;
    return true;
  }